

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O1

TestStatus *
vkt::wsi::anon_unknown_0::resizeSurfaceTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  size_type *psVar1;
  TestLog *log;
  bool bVar2;
  TestStatus *pTVar3;
  undefined8 nativeDisplay;
  undefined8 nativeWindow;
  bool bVar4;
  int iVar5;
  qpTestResult qVar6;
  undefined4 extraout_var;
  long *plVar7;
  undefined8 *puVar8;
  long lVar9;
  long *plVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  UVec2 testSize;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> physicalDevices;
  Unique<vk::Handle<(vk::HandleType)25>_> surface;
  ResultCollector results;
  UVec2 sizes [3];
  VkSurfaceCapabilitiesKHR capabilities;
  InstanceHelper instHelper;
  Vector<unsigned_int,_2> local_500;
  string local_4f8;
  Display *local_4d8;
  ulong *local_4d0;
  long local_4c8;
  ulong local_4c0;
  long lStack_4b8;
  long *local_4b0;
  long local_4a8;
  long local_4a0;
  long lStack_498;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> local_490;
  ulong *local_478;
  long local_470;
  ulong local_468 [2];
  VkSurfaceKHR local_458;
  InstanceInterface *pIStack_450;
  VkInstance local_448;
  VkAllocationCallbacks *pVStack_440;
  TestStatus *local_438;
  long local_430;
  long *local_428 [2];
  long local_418 [2];
  ResultCollector local_408;
  uint local_3b8 [6];
  VkSurfaceCapabilitiesKHR local_3a0;
  undefined1 local_368 [16];
  VkInstance local_358;
  VkAllocationCallbacks *pVStack_350;
  ios_base local_2f8 [272];
  undefined1 local_1e8 [32];
  DestroyInstanceFunc p_Stack_1c8;
  VkAllocationCallbacks *local_1c0;
  InstanceDriver local_1b8;
  
  log = context->m_testCtx->m_log;
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
  tcu::ResultCollector::ResultCollector(&local_408,log,(string *)local_1e8);
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)local_1e8,context,wsiType,(VkAllocationCallbacks *)0x0);
  iVar5 = (*context->m_testCtx->m_platform->_vptr_Platform[5])();
  createDisplay((MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)local_368,
                (Platform *)CONCAT44(extraout_var,iVar5),(Extensions *)local_1e8,wsiType);
  nativeDisplay = local_368._0_8_;
  local_3a0.minImageCount = 0;
  local_3a0.maxImageCount = 0;
  createWindow((MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)local_368,
               (Display *)local_368._0_8_,(Maybe<tcu::Vector<unsigned_int,_2>_> *)&local_3a0);
  nativeWindow = local_368._0_8_;
  local_4d8 = (Display *)local_368._0_8_;
  ::vk::enumeratePhysicalDevices
            (&local_490,&local_1b8.super_InstanceInterface,(VkInstance)local_1e8._24_8_);
  local_438 = __return_storage_ptr__;
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)local_368,&local_1b8.super_InstanceInterface,
             (VkInstance)local_1e8._24_8_,wsiType,(Display *)nativeDisplay,(Window *)nativeWindow,
             (VkAllocationCallbacks *)0x0);
  local_448 = local_358;
  pVStack_440 = pVStack_350;
  local_458.m_internal = local_368._0_8_;
  pIStack_450 = (InstanceInterface *)local_368._8_8_;
  local_3b8[0] = 0x40;
  local_3b8[1] = 0x40;
  local_3b8[2] = 0x7c;
  local_3b8[3] = 0x77;
  local_3b8[4] = 0x100;
  local_3b8[5] = 0x200;
  lVar9 = 0;
  do {
    local_500.m_data = *(uint (*) [2])(local_3b8 + lVar9 * 2);
    local_430 = lVar9;
    (**(code **)(*(long *)local_4d8 + 0x10))(local_4d8,&local_500);
    if (local_490.
        super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_490.
        super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar13 = 0;
      do {
        bVar4 = isSupportedByAnyQueue
                          (&local_1b8.super_InstanceInterface,
                           local_490.
                           super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar13],local_458);
        if (bVar4) {
          ::vk::wsi::getPhysicalDeviceSurfaceCapabilities
                    (&local_3a0,&local_1b8.super_InstanceInterface,
                     local_490.
                     super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13],local_458);
          bVar4 = local_500.m_data[1] == local_3a0.currentExtent.height;
          bVar2 = local_3a0.currentExtent.width == local_500.m_data[0];
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
          ::vk::operator<<((ostream *)local_368,&local_3a0.currentExtent);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
          std::ios_base::~ios_base(local_2f8);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)local_428,0,(char *)0x0,0xb39d66);
          local_4b0 = &local_4a0;
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_4a0 = *plVar10;
            lStack_498 = plVar7[3];
          }
          else {
            local_4a0 = *plVar10;
            local_4b0 = (long *)*plVar7;
          }
          local_4a8 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_4b0);
          local_4d0 = &local_4c0;
          puVar11 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar11) {
            local_4c0 = *puVar11;
            lStack_4b8 = plVar7[3];
          }
          else {
            local_4c0 = *puVar11;
            local_4d0 = (ulong *)*plVar7;
          }
          local_4c8 = plVar7[1];
          *plVar7 = (long)puVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
          tcu::operator<<((ostream *)local_368,&local_500);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
          std::ios_base::~ios_base(local_2f8);
          uVar12 = 0xf;
          if (local_4d0 != &local_4c0) {
            uVar12 = local_4c0;
          }
          if (uVar12 < (ulong)(local_470 + local_4c8)) {
            uVar12 = 0xf;
            if (local_478 != local_468) {
              uVar12 = local_468[0];
            }
            if (uVar12 < (ulong)(local_470 + local_4c8)) goto LAB_00735c7a;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,(ulong)local_4d0)
            ;
          }
          else {
LAB_00735c7a:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_4d0,(ulong)local_478);
          }
          local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
          psVar1 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_4f8.field_2._M_allocated_capacity = *psVar1;
            local_4f8.field_2._8_8_ = puVar8[3];
          }
          else {
            local_4f8.field_2._M_allocated_capacity = *psVar1;
            local_4f8._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_4f8._M_string_length = puVar8[1];
          *puVar8 = psVar1;
          puVar8[1] = 0;
          *(undefined1 *)psVar1 = 0;
          tcu::ResultCollector::check(&local_408,bVar4 && bVar2,&local_4f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
          }
          if (local_478 != local_468) {
            operator_delete(local_478,local_468[0] + 1);
          }
          if (local_4d0 != &local_4c0) {
            operator_delete(local_4d0,local_4c0 + 1);
          }
          if (local_4b0 != &local_4a0) {
            operator_delete(local_4b0,local_4a0 + 1);
          }
          if (local_428[0] != local_418) {
            operator_delete(local_428[0],local_418[0] + 1);
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < (ulong)((long)local_490.
                                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_490.
                                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    lVar9 = local_430 + 1;
    if (lVar9 == 3) {
      qVar6 = tcu::ResultCollector::getResult(&local_408);
      local_368._0_8_ = (Display *)&local_358;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_368,local_408.m_message._M_dataplus._M_p,
                 local_408.m_message._M_dataplus._M_p + local_408.m_message._M_string_length);
      pTVar3 = local_438;
      local_438->m_code = qVar6;
      (local_438->m_description)._M_dataplus._M_p = (pointer)&(local_438->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_438->m_description,local_368._0_8_,
                 (Display *)((long)(_func_int ***)local_368._8_8_ + local_368._0_8_));
      if ((Display *)local_368._0_8_ != (Display *)&local_358) {
        operator_delete((void *)local_368._0_8_,(ulong)(local_358 + 1));
      }
      if ((Display *)local_458.m_internal != (Display *)0x0) {
        (*pIStack_450->_vptr_InstanceInterface[0xd])
                  (pIStack_450,local_448,local_458.m_internal,pVStack_440);
      }
      if (local_490.
          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_490.
                        super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_490.
                              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_490.
                              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      (**(code **)(*(long *)local_4d8 + 8))();
      (**(code **)(*(long *)nativeDisplay + 8))();
      ::vk::InstanceDriver::~InstanceDriver(&local_1b8);
      if ((VkInstance)local_1e8._24_8_ != (VkInstance)0x0) {
        (*p_Stack_1c8)((VkInstance)local_1e8._24_8_,local_1c0);
      }
      local_1e8._24_8_ = 0;
      p_Stack_1c8 = (DestroyInstanceFunc)0x0;
      local_1c0 = (VkAllocationCallbacks *)0x0;
      if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ - local_1e8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408.m_message._M_dataplus._M_p != &local_408.m_message.field_2) {
        operator_delete(local_408.m_message._M_dataplus._M_p,
                        local_408.m_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408.m_prefix._M_dataplus._M_p != &local_408.m_prefix.field_2) {
        operator_delete(local_408.m_prefix._M_dataplus._M_p,
                        local_408.m_prefix.field_2._M_allocated_capacity + 1);
      }
      return pTVar3;
    }
  } while( true );
}

Assistant:

tcu::TestStatus resizeSurfaceTest (Context& context, Type wsiType)
{
	tcu::TestLog&					log				= context.getTestContext().getLog();
	tcu::ResultCollector			results			(log);

	const InstanceHelper			instHelper		(context, wsiType);

	const UniquePtr<Display>		nativeDisplay	(createDisplay(context.getTestContext().getPlatform().getVulkanPlatform(),
																   instHelper.supportedExtensions,
																   wsiType));
	UniquePtr<Window>				nativeWindow	(createWindow(*nativeDisplay, tcu::nothing<UVec2>()));

	const vector<VkPhysicalDevice>	physicalDevices	= enumeratePhysicalDevices(instHelper.vki, *instHelper.instance);
	const Unique<VkSurfaceKHR>		surface			(createSurface(instHelper.vki, *instHelper.instance, wsiType, *nativeDisplay, *nativeWindow));

	const UVec2						sizes[]			=
	{
		UVec2(64, 64),
		UVec2(124, 119),
		UVec2(256, 512)
	};

	DE_ASSERT(getPlatformProperties(wsiType).features & PlatformProperties::FEATURE_RESIZE_WINDOW);

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); ++sizeNdx)
	{
		const UVec2		testSize	= sizes[sizeNdx];

		try
		{
			nativeWindow->resize(testSize);
		}
		catch (const tcu::Exception& e)
		{
			// Make sure all exception types result in a test failure
			results.fail(e.getMessage());
		}

		for (size_t deviceNdx = 0; deviceNdx < physicalDevices.size(); ++deviceNdx)
		{
			if (isSupportedByAnyQueue(instHelper.vki, physicalDevices[deviceNdx], *surface))
			{
				const VkSurfaceCapabilitiesKHR	capabilities	= getPhysicalDeviceSurfaceCapabilities(instHelper.vki, physicalDevices[deviceNdx], *surface);

				// \note Assumes that surface size is NOT set by swapchain if initial window size is honored by platform
				results.check(capabilities.currentExtent.width == testSize.x() &&
								capabilities.currentExtent.height == testSize.y(),
								"currentExtent " + de::toString(capabilities.currentExtent) + " doesn't match requested size " + de::toString(testSize));
			}
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}